

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O1

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jbcoin::STTx::checkSingleSign_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,STTx *this)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t in_R8;
  Blob spk;
  Blob data;
  Blob signature;
  Blob local_c8;
  Blob local_b0;
  Blob local_98;
  pointer local_80;
  long local_78;
  pointer local_70;
  long local_68;
  Slice local_60;
  PublicKey local_50;
  
  bVar1 = STObject::isFieldPresent(&this->super_STObject,(SField *)sfSigners);
  if (bVar1) {
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar5 = "Cannot both single- and multi-sign.";
    pcVar4 = "";
  }
  else {
    uVar2 = STObject::getFlags(&this->super_STObject);
    STObject::getFieldVL(&local_c8,&this->super_STObject,(SField *)sfSigningPubKey);
    if (((long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start == 0x21) &&
       ((*local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start - 2 < 2 ||
        (*local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == 0xed)))) {
      STObject::getFieldVL(&local_98,&this->super_STObject,(SField *)sfTxnSignature);
      getSigningData(&local_b0,this);
      local_60.size_ =
           (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_60.data_ =
           local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      PublicKey::PublicKey(&local_50,&local_60);
      local_68 = (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      local_70 = local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_78 = (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
      local_80 = local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      iVar3 = verify((EVP_PKEY_CTX *)&local_50,(uchar *)&local_70,(size_t)&local_80,
                     (uchar *)(ulong)(uVar2 >> 0x1f),in_R8);
      if (local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((char)iVar3 != '\0') {
        __return_storage_ptr__->first = true;
        (__return_storage_ptr__->second)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->second).field_2;
        pcVar4 = "";
        pcVar5 = "";
        goto LAB_001bae99;
      }
    }
    else if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start != (byte *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    __return_storage_ptr__->first = false;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    pcVar5 = "Invalid signature.";
    pcVar4 = "";
  }
LAB_001bae99:
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__return_storage_ptr__->second,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> STTx::checkSingleSign () const
{
    // We don't allow both a non-empty sfSigningPubKey and an sfSigners.
    // That would allow the transaction to be signed two ways.  So if both
    // fields are present the signature is invalid.
    if (isFieldPresent (sfSigners))
        return {false, "Cannot both single- and multi-sign."};

    bool validSig = false;
    try
    {
        bool const fullyCanonical = (getFlags() & tfFullyCanonicalSig);
        auto const spk = getFieldVL (sfSigningPubKey);

        if (publicKeyType (makeSlice(spk)))
        {
            Blob const signature = getFieldVL (sfTxnSignature);
            Blob const data = getSigningData (*this);

            validSig = verify (
                PublicKey (makeSlice(spk)),
                makeSlice(data),
                makeSlice(signature),
                fullyCanonical);
        }
    }
    catch (std::exception const&)
    {
        // Assume it was a signature failure.
        validSig = false;
    }
    if (validSig == false)
        return {false, "Invalid signature."};

    return {true, ""};
}